

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O3

uint32_t AccumulateSSE_C(uint8_t *src1,uint8_t *src2,int len)

{
  uint32_t uVar1;
  ulong uVar2;
  
  if (0 < len) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + ((uint)src1[uVar2] - (uint)src2[uVar2]) *
                      ((uint)src1[uVar2] - (uint)src2[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

static uint32_t AccumulateSSE_C(const uint8_t* src1,
                                const uint8_t* src2, int len) {
  int i;
  uint32_t sse2 = 0;
  assert(len <= 65535);  // to ensure that accumulation fits within uint32_t
  for (i = 0; i < len; ++i) {
    const int32_t diff = src1[i] - src2[i];
    sse2 += diff * diff;
  }
  return sse2;
}